

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::YearWeekOperator>>
               (timestamp_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  timestamp_t tVar4;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long *plVar8;
  bool bVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  int64_t iVar11;
  idx_t idx_in_entry_1;
  ulong uVar12;
  ulong uVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  unsigned_long uVar15;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_80;
  ValidityMask *local_78;
  timestamp_t *local_70;
  idx_t local_68;
  long *local_60;
  ulong local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  ulong local_48;
  timestamp_t *local_40;
  long *local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_78 = mask;
  local_70 = ldata;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar14 = 0;
      do {
        tVar4.value = local_70[uVar14].value;
        bVar9 = Value::IsFinite<duckdb::timestamp_t>(tVar4);
        if (bVar9) {
          iVar11 = DatePart::YearWeekOperator::Operation<duckdb::timestamp_t,long>(tVar4);
        }
        else {
          if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var7 = p_Stack_90;
            peVar6 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).
                                  validity_data);
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar5 = (byte)uVar14 & 0x3f;
          puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   (uVar14 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          iVar11 = 0;
        }
        result_data[uVar14] = iVar11;
        uVar14 = uVar14 + 1;
      } while (count != uVar14);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_80 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_98,(unsigned_long **)mask,&local_80);
      p_Var7 = p_Stack_90;
      peVar6 = local_98;
      local_98 = (element_type *)0x0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar6;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var7;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data)
      ;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar10->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_58 = count + 0x3f >> 6;
      local_50 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      local_48 = 0;
      uVar14 = 0;
      local_68 = count;
      local_60 = result_data;
      do {
        plVar8 = local_60;
        puVar2 = (local_78->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar15 = 0xffffffffffffffff;
        }
        else {
          uVar15 = puVar2[local_48];
        }
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
        uVar13 = uVar12;
        if (uVar15 != 0) {
          uVar13 = uVar14;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar14 < uVar12) {
              do {
                tVar4.value = local_70[uVar14].value;
                bVar9 = Value::IsFinite<duckdb::timestamp_t>(tVar4);
                if (bVar9) {
                  iVar11 = DatePart::YearWeekOperator::Operation<duckdb::timestamp_t,long>(tVar4);
                }
                else {
                  if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                      (unsigned_long *)0x0) {
                    local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_80);
                    p_Var7 = p_Stack_90;
                    peVar6 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data
                             .internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar6;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var7;
                    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                    }
                    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_50);
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         (unsigned_long *)
                         (pTVar10->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
                  }
                  bVar5 = (byte)uVar14 & 0x3f;
                  puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                           (uVar14 >> 6);
                  *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                  iVar11 = 0;
                }
                plVar8[uVar14] = iVar11;
                uVar14 = uVar14 + 1;
                uVar13 = uVar14;
              } while (uVar12 != uVar14);
            }
          }
          else {
            count = local_68;
            if (uVar14 < uVar12) {
              local_38 = local_60 + uVar14;
              local_40 = local_70 + uVar14;
              uVar13 = 0;
              do {
                if ((uVar15 >> (uVar13 & 0x3f) & 1) != 0) {
                  tVar4.value = local_40[uVar13].value;
                  bVar9 = Value::IsFinite<duckdb::timestamp_t>(tVar4);
                  if (bVar9) {
                    iVar11 = DatePart::YearWeekOperator::Operation<duckdb::timestamp_t,long>(tVar4);
                  }
                  else {
                    if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                        (unsigned_long *)0x0) {
                      local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)&local_98,&local_80);
                      p_Var7 = p_Stack_90;
                      peVar6 = local_98;
                      local_98 = (element_type *)0x0;
                      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = peVar6;
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = p_Var7;
                      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                      }
                      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                      }
                      pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->(local_50);
                      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                           (unsigned_long *)
                           (pTVar10->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    bVar5 = (byte)(uVar13 + uVar14) & 0x3f;
                    puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
                             + (uVar13 + uVar14 >> 6);
                    *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                    iVar11 = 0;
                  }
                  local_38[uVar13] = iVar11;
                }
                uVar13 = uVar13 + 1;
              } while ((uVar14 - uVar12) + uVar13 != 0);
              uVar13 = uVar14 + uVar13;
              count = local_68;
            }
          }
        }
        local_48 = local_48 + 1;
        uVar14 = uVar13;
      } while (local_48 != local_58);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}